

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

QBrush __thiscall QCss::Declaration::brushValue(Declaration *this,QPalette *pal)

{
  Value *pVVar1;
  int iVar2;
  ColorRole cr;
  QColor *pQVar3;
  QPalette *in_RDX;
  QPalettePrivate *pQVar4;
  long in_FS_OFFSET;
  int local_5c;
  undefined1 *local_58;
  undefined1 auStack_50 [40];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = pal->d;
  if (pQVar4[1].data.d.ptr != (Data *)0x1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QBrush::QBrush((QBrush *)this);
      return (DataPtr)(DataPtr)this;
    }
    goto LAB_0053f9d1;
  }
  if ((Data *)0x3 < pQVar4[2].data.d.ptr) {
    iVar2 = ::QVariant::typeId((QVariant *)(pQVar4 + 2));
    if (iVar2 == 0x1002) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qvariant_cast<QBrush>((QVariant *)this);
        return (DataPtr)(DataPtr)this;
      }
      goto LAB_0053f9d1;
    }
    iVar2 = ::QVariant::typeId((QVariant *)(pal->d + 2));
    pQVar4 = pal->d;
    if (iVar2 == 2) {
      cr = ::QVariant::toInt((bool *)(pQVar4 + 2));
      pQVar3 = QPalette::color(in_RDX,cr);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QBrush::QBrush((QBrush *)this,pQVar3,SolidPattern);
        return (DataPtr)(DataPtr)this;
      }
      goto LAB_0053f9d1;
    }
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  parseBrushValue((Value *)&local_58,*(QPalette **)&pQVar4[1].detach_no);
  if (auStack_50._4_4_ == 3) {
LAB_0053f99b:
    QBrush::QBrush((QBrush *)this,(QBrush *)&local_58);
  }
  else {
    if (auStack_50._4_4_ != 2) {
      pVVar1 = (Value *)(auStack_50 + 8);
      ::QVariant::fromValue<QBrush>
                ((enable_if_t<std::is_copy_constructible_v<QBrush>_&&_std::is_destructible_v<QBrush>,_QVariant>
                  *)pVVar1,(QBrush *)&local_58);
      ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)pVVar1);
      ::QVariant::~QVariant((QVariant *)pVVar1);
      goto LAB_0053f99b;
    }
    local_5c = auStack_50._0_4_;
    pVVar1 = (Value *)(auStack_50 + 8);
    ::QVariant::fromValue<int,_true>
              ((enable_if_t<std::conjunction_v<std::is_copy_constructible<int>,_std::is_destructible<int>_>,_QVariant>
                *)pVVar1,&local_5c);
    ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)pVVar1);
    ::QVariant::~QVariant((QVariant *)pVVar1);
    pQVar3 = QPalette::color(in_RDX,auStack_50._0_4_);
    QBrush::QBrush((QBrush *)this,pQVar3,SolidPattern);
  }
  QBrush::~QBrush((QBrush *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (DataPtr)(DataPtr)this;
  }
LAB_0053f9d1:
  __stack_chk_fail();
}

Assistant:

QBrush Declaration::brushValue(const QPalette &pal) const
{
    if (d->values.size() != 1)
        return QBrush();

    if (d->parsed.isValid()) {
        if (d->parsed.userType() == QMetaType::QBrush)
            return qvariant_cast<QBrush>(d->parsed);
        if (d->parsed.userType() == QMetaType::Int)
            return pal.color((QPalette::ColorRole)(d->parsed.toInt()));
    }

    BrushData data = parseBrushValue(d->values.at(0), pal);

    if (data.type == BrushData::Role) {
        d->parsed = QVariant::fromValue<int>(data.role);
        return pal.color((QPalette::ColorRole)(data.role));
    } else {
        if (data.type != BrushData::DependsOnThePalette)
            d->parsed = QVariant::fromValue<QBrush>(data.brush);
        return data.brush;
    }
}